

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall FConsoleAlias::PrintAlias(FConsoleAlias *this)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  FConsoleAlias *this_local;
  
  bVar2 = FString::IsNotEmpty(this->m_Command);
  if (bVar2) {
    pcVar1 = (this->super_FConsoleCommand).m_Name;
    pcVar3 = FString::GetChars(this->m_Command);
    Printf("\x1cK%s : %s\n",pcVar1,pcVar3);
  }
  bVar2 = FString::IsNotEmpty(this->m_Command + 1);
  if (bVar2) {
    pcVar1 = (this->super_FConsoleCommand).m_Name;
    pcVar3 = FString::GetChars(this->m_Command + 1);
    Printf("\x1cI%s : %s\n",pcVar1,pcVar3);
  }
  return;
}

Assistant:

void FConsoleAlias::PrintAlias ()
{
	if (m_Command[0].IsNotEmpty())
	{
		Printf (TEXTCOLOR_YELLOW "%s : %s\n", m_Name, m_Command[0].GetChars());
	}
	if (m_Command[1].IsNotEmpty())
	{
		Printf (TEXTCOLOR_ORANGE "%s : %s\n", m_Name, m_Command[1].GetChars());
	}
}